

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O1

void on_underlying_io_close_complete(void *context)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  UWS_CLIENT_HANDLE uws_client;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                 ,"on_underlying_io_close_complete",0x38b,1,
                 "NULL context for on_underlying_io_close_complete");
      return;
    }
  }
  else if (*(int *)((long)context + 0x40) == 6) {
    *(undefined4 *)((long)context + 0x40) = 0;
    if (*(code **)((long)context + 0x88) != (code *)0x0) {
      (**(code **)((long)context + 0x88))(*(undefined8 *)((long)context + 0x90));
    }
    *(undefined4 *)((long)context + 0x40) = 0;
  }
  return;
}

Assistant:

static void on_underlying_io_close_complete(void* context)
{
    if (context == NULL)
    {
        /* Codes_SRS_UWS_CLIENT_01_477: [ When on_underlying_io_close_complete is called with a NULL context, it shall do nothing. ]*/
        LogError("NULL context for on_underlying_io_close_complete");
    }
    else
    {
        UWS_CLIENT_HANDLE uws_client = (UWS_CLIENT_HANDLE)context;
        if (uws_client->uws_state == UWS_STATE_CLOSING_UNDERLYING_IO)
        {
            /* Codes_SRS_UWS_CLIENT_01_475: [ When on_underlying_io_close_complete is called while closing the underlying IO a subsequent uws_client_open_async shall succeed. ]*/
            indicate_ws_close_complete(uws_client);
            uws_client->uws_state = UWS_STATE_CLOSED;
        }
    }
}